

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

void __thiscall
p2t::Sweep::FillRightBelowEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  double dVar2;
  Point *pPVar3;
  Point *pPVar4;
  double dVar5;
  
  while( true ) {
    dVar5 = node->point->x;
    if (edge->p->x <= dVar5) {
      return;
    }
    pPVar3 = node->next->point;
    pPVar4 = node->next->next->point;
    dVar1 = pPVar4->x;
    dVar2 = pPVar4->y;
    dVar5 = (pPVar3->y - dVar2) * (dVar5 - dVar1) - (pPVar3->x - dVar1) * (node->point->y - dVar2);
    if ((1e-12 <= ABS(dVar5)) && (0.0 < dVar5)) break;
    FillRightConvexEdgeEvent(this,tcx,edge,node);
  }
  FillRightConcaveEdgeEvent(this,tcx,edge,node);
  return;
}

Assistant:

void Sweep::FillRightBelowEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  if (node.point->x < edge->p->x) {
    if (Orient2d(*node.point, *node.next->point, *node.next->next->point) == CCW) {
      // Concave
      FillRightConcaveEdgeEvent(tcx, edge, node);
    } else{
      // Convex
      FillRightConvexEdgeEvent(tcx, edge, node);
      // Retry this one
      FillRightBelowEdgeEvent(tcx, edge, node);
    }
  }
}